

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# replace_desc_array_access_using_var_index.cpp
# Opt level: O2

void __thiscall
spvtools::opt::ReplaceDescArrayAccessUsingVarIndex::CloneInstsToBlock
          (ReplaceDescArrayAccessUsingVarIndex *this,BasicBlock *block,
          Instruction *inst_to_skip_cloning,
          deque<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
          *insts_to_be_cloned,
          unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
          *old_ids_to_new_ids)

{
  Instruction *this_00;
  uint32_t res_id;
  Instruction *this_01;
  mapped_type *pmVar1;
  DefUseManager *this_02;
  _Elt_pointer ppIVar2;
  uint32_t local_64;
  _Map_pointer local_60;
  _Elt_pointer local_58;
  BasicBlock *local_50;
  _Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
  *local_48;
  Instruction *local_40;
  _Elt_pointer local_38;
  
  ppIVar2 = (insts_to_be_cloned->
            super__Deque_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
            )._M_impl.super__Deque_impl_data._M_start._M_cur;
  local_58 = (insts_to_be_cloned->
             super__Deque_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
             )._M_impl.super__Deque_impl_data._M_start._M_last;
  local_60 = (insts_to_be_cloned->
             super__Deque_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
             )._M_impl.super__Deque_impl_data._M_start._M_node;
  local_38 = (insts_to_be_cloned->
             super__Deque_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
             )._M_impl.super__Deque_impl_data._M_finish._M_cur;
  local_40 = &(block->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_;
  local_50 = block;
  local_48 = (_Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              *)old_ids_to_new_ids;
  while (ppIVar2 != local_38) {
    this_00 = *ppIVar2;
    if (this_00 != inst_to_skip_cloning) {
      this_01 = Instruction::Clone(this_00,(this->super_Pass).context_);
      if (this_00->has_result_id_ == true) {
        res_id = IRContext::TakeNextId((this->super_Pass).context_);
        Instruction::SetResultId(this_01,res_id);
        local_64 = Instruction::result_id(this_00);
        pmVar1 = std::__detail::
                 _Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 ::operator[](local_48,&local_64);
        *pmVar1 = res_id;
        block = local_50;
      }
      this_02 = Pass::get_def_use_mgr(&this->super_Pass);
      analysis::DefUseManager::AnalyzeInstDefUse(this_02,this_01);
      IRContext::set_instr_block((this->super_Pass).context_,this_01,block);
      utils::IntrusiveNodeBase<spvtools::opt::Instruction>::InsertBefore
                (&this_01->super_IntrusiveNodeBase<spvtools::opt::Instruction>,local_40);
    }
    ppIVar2 = ppIVar2 + 1;
    if (ppIVar2 == local_58) {
      ppIVar2 = local_60[1];
      local_60 = local_60 + 1;
      local_58 = ppIVar2 + 0x40;
    }
  }
  return;
}

Assistant:

void ReplaceDescArrayAccessUsingVarIndex::CloneInstsToBlock(
    BasicBlock* block, Instruction* inst_to_skip_cloning,
    const std::deque<Instruction*>& insts_to_be_cloned,
    std::unordered_map<uint32_t, uint32_t>* old_ids_to_new_ids) const {
  for (auto* inst_to_be_cloned : insts_to_be_cloned) {
    if (inst_to_be_cloned == inst_to_skip_cloning) continue;
    std::unique_ptr<Instruction> clone(inst_to_be_cloned->Clone(context()));
    if (inst_to_be_cloned->HasResultId()) {
      uint32_t new_id = context()->TakeNextId();
      clone->SetResultId(new_id);
      (*old_ids_to_new_ids)[inst_to_be_cloned->result_id()] = new_id;
    }
    get_def_use_mgr()->AnalyzeInstDefUse(clone.get());
    context()->set_instr_block(clone.get(), block);
    block->AddInstruction(std::move(clone));
  }
}